

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_detect_format(hFILE *hfile,htsFormat *fmt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  ushort uVar7;
  int iVar8;
  ssize_t sVar9;
  htsCompression hVar10;
  bool bVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  size_t local_40;
  ssize_t len;
  uchar s [21];
  htsFormat *fmt_local;
  hFILE *hfile_local;
  
  unique0x1000156b = fmt;
  sVar9 = hpeek(hfile,&len,0x12);
  if (sVar9 < 0) {
    return -1;
  }
  if (((sVar9 < 2) || ((char)len != '\x1f')) || (len._1_1_ != -0x75)) {
    stack0xffffffffffffffe0->compression = no_compression;
    local_40 = hpeek(hfile,&len,0x15);
  }
  else {
    bVar11 = false;
    if ((0x11 < sVar9) && (bVar11 = false, ((uint)len & 0x4000000) != 0)) {
      bVar11 = s._4_4_ == 0x24342;
    }
    hVar10 = gzip;
    if (bVar11) {
      hVar10 = bgzf;
    }
    stack0xffffffffffffffe0->compression = hVar10;
    local_40 = decompress_peek(hfile,(uchar *)&len,0x15);
  }
  if ((long)local_40 < 0) {
    return -1;
  }
  stack0xffffffffffffffe0->compression_level = -1;
  stack0xffffffffffffffe0->specific = (void *)0x0;
  if (((5 < (long)local_40) && ((uint)len == 0x4d415243)) &&
     ((len._4_1_ != 0 && ((len._4_1_ < 4 && (len._5_1_ < 2)))))) {
    stack0xffffffffffffffe0->category = sequence_data;
    stack0xffffffffffffffe0->format = cram;
    (stack0xffffffffffffffe0->version).major = (ushort)len._4_1_;
    (stack0xffffffffffffffe0->version).minor = (ushort)len._5_1_;
    stack0xffffffffffffffe0->compression = custom;
    return 0;
  }
  if (((long)local_40 < 4) || (4 < len._3_1_)) {
    if (0xf < (long)local_40) {
      cVar12 = -(len._2_1_ == 'f');
      cVar13 = -(len._3_1_ == 'i');
      cVar14 = -(len._4_1_ == 'l');
      cVar15 = -(len._5_1_ == 'e');
      cVar16 = -(len._6_1_ == 'f');
      cVar17 = -(len._7_1_ == 'o');
      cVar18 = -(s[0] == 'r');
      cVar19 = -(s[1] == 'm');
      cVar20 = -(s[2] == 'a');
      cVar21 = -(s[3] == 't');
      cVar22 = -(s[4] == '=');
      cVar23 = -(s[5] == 'V');
      cVar24 = -(s[6] == 'C');
      bVar25 = -(s[7] == 'F');
      auVar1[1] = -(len._1_1_ == '#');
      auVar1[0] = -((char)len == '#');
      auVar1[2] = cVar12;
      auVar1[3] = cVar13;
      auVar1[4] = cVar14;
      auVar1[5] = cVar15;
      auVar1[6] = cVar16;
      auVar1[7] = cVar17;
      auVar1[8] = cVar18;
      auVar1[9] = cVar19;
      auVar1[10] = cVar20;
      auVar1[0xb] = cVar21;
      auVar1[0xc] = cVar22;
      auVar1[0xd] = cVar23;
      auVar1[0xe] = cVar24;
      auVar1[0xf] = bVar25;
      auVar2[1] = -(len._1_1_ == '#');
      auVar2[0] = -((char)len == '#');
      auVar2[2] = cVar12;
      auVar2[3] = cVar13;
      auVar2[4] = cVar14;
      auVar2[5] = cVar15;
      auVar2[6] = cVar16;
      auVar2[7] = cVar17;
      auVar2[8] = cVar18;
      auVar2[9] = cVar19;
      auVar2[10] = cVar20;
      auVar2[0xb] = cVar21;
      auVar2[0xc] = cVar22;
      auVar2[0xd] = cVar23;
      auVar2[0xe] = cVar24;
      auVar2[0xf] = bVar25;
      auVar6[1] = cVar13;
      auVar6[0] = cVar12;
      auVar6[2] = cVar14;
      auVar6[3] = cVar15;
      auVar6[4] = cVar16;
      auVar6[5] = cVar17;
      auVar6[6] = cVar18;
      auVar6[7] = cVar19;
      auVar6[8] = cVar20;
      auVar6[9] = cVar21;
      auVar6[10] = cVar22;
      auVar6[0xb] = cVar23;
      auVar6[0xc] = cVar24;
      auVar6[0xd] = bVar25;
      auVar5[1] = cVar14;
      auVar5[0] = cVar13;
      auVar5[2] = cVar15;
      auVar5[3] = cVar16;
      auVar5[4] = cVar17;
      auVar5[5] = cVar18;
      auVar5[6] = cVar19;
      auVar5[7] = cVar20;
      auVar5[8] = cVar21;
      auVar5[9] = cVar22;
      auVar5[10] = cVar23;
      auVar5[0xb] = cVar24;
      auVar5[0xc] = bVar25;
      auVar4[1] = cVar15;
      auVar4[0] = cVar14;
      auVar4[2] = cVar16;
      auVar4[3] = cVar17;
      auVar4[4] = cVar18;
      auVar4[5] = cVar19;
      auVar4[6] = cVar20;
      auVar4[7] = cVar21;
      auVar4[8] = cVar22;
      auVar4[9] = cVar23;
      auVar4[10] = cVar24;
      auVar4[0xb] = bVar25;
      auVar3[1] = cVar16;
      auVar3[0] = cVar15;
      auVar3[2] = cVar17;
      auVar3[3] = cVar18;
      auVar3[4] = cVar19;
      auVar3[5] = cVar20;
      auVar3[6] = cVar21;
      auVar3[7] = cVar22;
      auVar3[8] = cVar23;
      auVar3[9] = cVar24;
      auVar3[10] = bVar25;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar25 >> 7) << 0xf) == 0xffff) {
        stack0xffffffffffffffe0->category = variant_data;
        stack0xffffffffffffffe0->format = vcf;
        if (((long)local_40 < 0x15) || (s[8] != 'v')) {
          (stack0xffffffffffffffe0->version).minor = -1;
          (stack0xffffffffffffffe0->version).major = -1;
        }
        else {
          parse_version(stack0xffffffffffffffe0,s + 9,s + (local_40 - 8));
        }
        return 0;
      }
    }
    if (((3 < (long)local_40) && ((char)len == '@')) &&
       (((uint)len == 0x9444840 ||
        ((((uint)len == 0x9515340 || ((uint)len == 0x9475240)) || ((uint)len == 0x9475040)))))) {
      stack0xffffffffffffffe0->category = sequence_data;
      stack0xffffffffffffffe0->format = sam;
      if (((long)local_40 < 9) || (iVar8 = memcmp(&len,"@HD\tVN:",7), iVar8 != 0)) {
        (stack0xffffffffffffffe0->version).major = 1;
        (stack0xffffffffffffffe0->version).minor = -1;
      }
      else {
        parse_version(stack0xffffffffffffffe0,(uchar *)((long)&len + 7),s + (local_40 - 8));
      }
      return 0;
    }
    stack0xffffffffffffffe0->category = sequence_data;
    stack0xffffffffffffffe0->format = sam;
    (stack0xffffffffffffffe0->version).major = 1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  if ((uint)len == 0x14d4142) {
    stack0xffffffffffffffe0->category = sequence_data;
    stack0xffffffffffffffe0->format = bam;
    (stack0xffffffffffffffe0->version).major = 1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  if ((uint)len == 0x1494142) {
    stack0xffffffffffffffe0->category = index_file;
    stack0xffffffffffffffe0->format = bai;
    (stack0xffffffffffffffe0->version).major = -1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  if ((uint)len == 0x4464342) {
    stack0xffffffffffffffe0->category = variant_data;
    stack0xffffffffffffffe0->format = bcf;
    (stack0xffffffffffffffe0->version).major = 1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  if ((uint)len == 0x2464342) {
    stack0xffffffffffffffe0->category = variant_data;
    stack0xffffffffffffffe0->format = bcf;
    (stack0xffffffffffffffe0->version).major = (ushort)len._3_1_;
    if (((long)local_40 < 5) || (2 < len._4_1_)) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ushort)len._4_1_;
    }
    (stack0xffffffffffffffe0->version).minor = uVar7;
    return 0;
  }
  if ((uint)len == 0x1495343) {
    stack0xffffffffffffffe0->category = index_file;
    stack0xffffffffffffffe0->format = csi;
    (stack0xffffffffffffffe0->version).major = 1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  if ((uint)len == 0x1494254) {
    stack0xffffffffffffffe0->category = index_file;
    stack0xffffffffffffffe0->format = tbi;
    (stack0xffffffffffffffe0->version).major = -1;
    (stack0xffffffffffffffe0->version).minor = -1;
    return 0;
  }
  stack0xffffffffffffffe0->category = unknown_category;
  stack0xffffffffffffffe0->format = unknown_format;
  (stack0xffffffffffffffe0->version).minor = -1;
  (stack0xffffffffffffffe0->version).major = -1;
  stack0xffffffffffffffe0->compression = no_compression;
  return 0;
}

Assistant:

int hts_detect_format(hFILE *hfile, htsFormat *fmt)
{
    unsigned char s[21];
    ssize_t len = hpeek(hfile, s, 18);
    if (len < 0) return -1;

    if (len >= 2 && s[0] == 0x1f && s[1] == 0x8b) {
        // The stream is either gzip-compressed or BGZF-compressed.
        // Determine which, and decompress the first few bytes.
        fmt->compression = (len >= 18 && (s[3] & 4) &&
                            memcmp(&s[12], "BC\2\0", 4) == 0)? bgzf : gzip;
        len = decompress_peek(hfile, s, sizeof s);
    }
    else {
        fmt->compression = no_compression;
        len = hpeek(hfile, s, sizeof s);
    }
    if (len < 0) return -1;

    fmt->compression_level = -1;
    fmt->specific = NULL;

    if (len >= 6 && memcmp(s,"CRAM",4) == 0 && s[4]>=1 && s[4]<=3 && s[5]<=1) {
        fmt->category = sequence_data;
        fmt->format = cram;
        fmt->version.major = s[4], fmt->version.minor = s[5];
        fmt->compression = custom;
        return 0;
    }
    else if (len >= 4 && s[3] <= '\4') {
        if (memcmp(s, "BAM\1", 4) == 0) {
            fmt->category = sequence_data;
            fmt->format = bam;
            // TODO Decompress enough to pick version from @HD-VN header
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BAI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = bai;
            fmt->version.major = -1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BCF\4", 4) == 0) {
            fmt->category = variant_data;
            fmt->format = bcf;
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "BCF\2", 4) == 0) {
            fmt->category = variant_data;
            fmt->format = bcf;
            fmt->version.major = s[3];
            fmt->version.minor = (len >= 5 && s[4] <= 2)? s[4] : 0;
            return 0;
        }
        else if (memcmp(s, "CSI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = csi;
            fmt->version.major = 1, fmt->version.minor = -1;
            return 0;
        }
        else if (memcmp(s, "TBI\1", 4) == 0) {
            fmt->category = index_file;
            fmt->format = tbi;
            fmt->version.major = -1, fmt->version.minor = -1;
            return 0;
        }
    }
    else if (len >= 16 && memcmp(s, "##fileformat=VCF", 16) == 0) {
        fmt->category = variant_data;
        fmt->format = vcf;
        if (len >= 21 && s[16] == 'v')
            parse_version(fmt, &s[17], &s[len]);
        else
            fmt->version.major = fmt->version.minor = -1;
        return 0;
    }
    else if (len >= 4 && s[0] == '@' &&
             (memcmp(s, "@HD\t", 4) == 0 || memcmp(s, "@SQ\t", 4) == 0 ||
              memcmp(s, "@RG\t", 4) == 0 || memcmp(s, "@PG\t", 4) == 0)) {
        fmt->category = sequence_data;
        fmt->format = sam;
        // @HD-VN is not guaranteed to be the first tag, but then @HD is
        // not guaranteed to be present at all...
        if (len >= 9 && memcmp(s, "@HD\tVN:", 7) == 0)
            parse_version(fmt, &s[7], &s[len]);
        else
            fmt->version.major = 1, fmt->version.minor = -1;
        return 0;
    }
    else {
        // Various possibilities for tab-delimited text:
        // .crai   (gzipped tab-delimited six columns: seqid 5*number)
        // .bed    ([3..12] tab-delimited columns)
        // .bedpe  (>= 10 tab-delimited columns)
        // .sam    (tab-delimited >= 11 columns: seqid number seqid...)
        // FIXME For now, assume it's SAM
        fmt->category = sequence_data;
        fmt->format = sam;
        fmt->version.major = 1, fmt->version.minor = -1;
        return 0;
    }

    fmt->category = unknown_category;
    fmt->format = unknown_format;
    fmt->version.major = fmt->version.minor = -1;
    fmt->compression = no_compression;
    return 0;
}